

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall chrono::ChBody::IntStateGatherAcceleration(ChBody *this,uint off_a,ChStateDelta *a)

{
  Index index_1;
  double *pdVar1;
  Index index;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  double local_28 [3];
  
  if ((a->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
      (long)(ulong)off_a) goto LAB_0050643a;
  pdVar1 = (a->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + off_a;
  uVar2 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar3 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar3 < 3) {
      uVar2 = (ulong)uVar3;
    }
    if (uVar3 != 0) goto LAB_0050638d;
  }
  else {
LAB_0050638d:
    uVar4 = 0;
    do {
      pdVar1[uVar4] =
           (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dtdt.pos.m_data[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  if (uVar2 < 3) {
    do {
      pdVar1[uVar2] =
           (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dtdt.pos.m_data[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar2 != 3);
  }
  ChFrameMoving<double>::GetWacc_loc(&(this->super_ChBodyFrame).super_ChFrameMoving<double>);
  if ((a->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
      (long)(ulong)(off_a + 3)) {
LAB_0050643a:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar1 = (a->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           (off_a + 3);
  uVar2 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar3 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar3 < 3) {
      uVar2 = (ulong)uVar3;
    }
    if (uVar3 == 0) goto LAB_00506419;
  }
  uVar4 = 0;
  do {
    pdVar1[uVar4] = local_28[uVar4];
    uVar4 = uVar4 + 1;
  } while (uVar2 != uVar4);
LAB_00506419:
  if (uVar2 < 3) {
    do {
      pdVar1[uVar2] = local_28[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar2 != 3);
  }
  return;
}

Assistant:

void ChBody::IntStateGatherAcceleration(const unsigned int off_a, ChStateDelta& a) {
    a.segment(off_a + 0, 3) = this->coord_dtdt.pos.eigen();
    a.segment(off_a + 3, 3) = this->GetWacc_loc().eigen();
}